

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3MatchEName(ExprList_item *pItem,char *zCol,char *zTab,char *zDb,int *pbRowid)

{
  char *pcVar1;
  int iVar2;
  ushort uVar3;
  char *zLeft;
  long lVar4;
  
  uVar3 = *(ushort *)&(pItem->fg).field_0x1 & 3;
  if (uVar3 != 2) {
    if (pbRowid == (int *)0x0) {
      return 0;
    }
    if (uVar3 != 3) {
      return 0;
    }
  }
  lVar4 = 0;
  pcVar1 = pItem->zEName;
  while( true ) {
    if ((*pcVar1 == '\0') || (*pcVar1 == '.')) break;
    lVar4 = lVar4 + 1;
    pcVar1 = pcVar1 + 1;
  }
  if (zDb != (char *)0x0) {
    iVar2 = sqlite3_strnicmp(pItem->zEName,zDb,(int)lVar4);
    if (iVar2 != 0) {
      return 0;
    }
    if (zDb[lVar4] != '\0') {
      return 0;
    }
  }
  lVar4 = 0;
  for (zLeft = pcVar1 + 2; (zLeft[-1] != '\0' && (zLeft[-1] != '.')); zLeft = zLeft + 1) {
    lVar4 = lVar4 + 1;
  }
  if (zTab != (char *)0x0) {
    iVar2 = sqlite3_strnicmp(pcVar1 + 1,zTab,(int)lVar4);
    if (iVar2 != 0) {
      return 0;
    }
    if (zTab[lVar4] != '\0') {
      return 0;
    }
  }
  if (zCol == (char *)0x0) {
    if (uVar3 != 3) {
      return 1;
    }
  }
  else {
    if (uVar3 != 3) {
      if (uVar3 != 2) {
        return 1;
      }
      iVar2 = sqlite3StrICmp(zLeft,zCol);
      return (uint)(iVar2 == 0);
    }
    iVar2 = sqlite3IsRowid(zCol);
    if (iVar2 == 0) {
      return 0;
    }
  }
  *pbRowid = 1;
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3MatchEName(
  const struct ExprList_item *pItem,
  const char *zCol,
  const char *zTab,
  const char *zDb,
  int *pbRowid
){
  int n;
  const char *zSpan;
  int eEName = pItem->fg.eEName;
  if( eEName!=ENAME_TAB && (eEName!=ENAME_ROWID || NEVER(pbRowid==0)) ){
    return 0;
  }
  assert( pbRowid==0 || *pbRowid==0 );
  zSpan = pItem->zEName;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zDb && (sqlite3StrNICmp(zSpan, zDb, n)!=0 || zDb[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zTab && (sqlite3StrNICmp(zSpan, zTab, n)!=0 || zTab[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  if( zCol ){
    if( eEName==ENAME_TAB && sqlite3StrICmp(zSpan, zCol)!=0 ) return 0;
    if( eEName==ENAME_ROWID && sqlite3IsRowid(zCol)==0 ) return 0;
  }
  if( eEName==ENAME_ROWID ) *pbRowid = 1;
  return 1;
}